

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int RecordTokens(VP8EncIterator *it,VP8ModeScore *rd,VP8TBuffer *tokens)

{
  VP8Encoder *enc_00;
  int iVar1;
  long in_RDX;
  long in_RSI;
  VP8EncIterator *in_RDI;
  int ctx_2;
  int ctx_1;
  int ctx;
  VP8Encoder *enc;
  VP8Residual res;
  int ch;
  int y;
  int x;
  VP8TBuffer *in_stack_ffffffffffffffc0;
  VP8Residual *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int local_24;
  int local_20;
  int local_1c;
  
  enc_00 = in_RDI->enc_;
  VP8IteratorNzToBytes(in_RDI);
  if (((uint)*in_RDI->mb_ & 3) == 1) {
    VP8InitResidual(0,1,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
    (*VP8SetResidualCoeffs)((int16_t *)(in_RSI + 0x28),(VP8Residual *)&stack0xffffffffffffffa8);
    iVar1 = VP8RecordCoeffTokens
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                      );
    in_RDI->left_nz_[8] = iVar1;
    in_RDI->top_nz_[8] = iVar1;
    VP8InitResidual(1,0,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
  }
  else {
    VP8InitResidual(0,3,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
  }
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      (*VP8SetResidualCoeffs)
                ((int16_t *)(in_RSI + 0x48 + (long)(local_1c + local_20 * 4) * 0x20),
                 (VP8Residual *)&stack0xffffffffffffffa8);
      iVar1 = VP8RecordCoeffTokens
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0);
      in_RDI->left_nz_[local_20] = iVar1;
      in_RDI->top_nz_[local_1c] = iVar1;
    }
  }
  VP8InitResidual(0,2,enc_00,(VP8Residual *)&stack0xffffffffffffffa8);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 2) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
        (*VP8SetResidualCoeffs)
                  ((int16_t *)
                   (in_RSI + 0x248 + (long)(local_24 * 2 + local_1c + local_20 * 2) * 0x20),
                   (VP8Residual *)&stack0xffffffffffffffa8);
        iVar1 = VP8RecordCoeffTokens
                          (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                           in_stack_ffffffffffffffc0);
        in_RDI->left_nz_[local_24 + 4 + local_20] = iVar1;
        in_RDI->top_nz_[local_24 + 4 + local_1c] = iVar1;
      }
    }
  }
  VP8IteratorBytesToNz(in_RDI);
  return (int)((*(int *)(in_RDX + 0x20) != 0 ^ 0xffU) & 1);
}

Assistant:

static int RecordTokens(VP8EncIterator* const it, const VP8ModeScore* const rd,
                        VP8TBuffer* const tokens) {
  int x, y, ch;
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;

  VP8IteratorNzToBytes(it);
  if (it->mb_->type_ == 1) {   // i16x16
    const int ctx = it->top_nz_[8] + it->left_nz_[8];
    VP8InitResidual(0, 1, enc, &res);
    VP8SetResidualCoeffs(rd->y_dc_levels, &res);
    it->top_nz_[8] = it->left_nz_[8] =
        VP8RecordCoeffTokens(ctx, &res, tokens);
    VP8InitResidual(1, 0, enc, &res);
  } else {
    VP8InitResidual(0, 3, enc, &res);
  }

  // luma-AC
  for (y = 0; y < 4; ++y) {
    for (x = 0; x < 4; ++x) {
      const int ctx = it->top_nz_[x] + it->left_nz_[y];
      VP8SetResidualCoeffs(rd->y_ac_levels[x + y * 4], &res);
      it->top_nz_[x] = it->left_nz_[y] =
          VP8RecordCoeffTokens(ctx, &res, tokens);
    }
  }

  // U/V
  VP8InitResidual(0, 2, enc, &res);
  for (ch = 0; ch <= 2; ch += 2) {
    for (y = 0; y < 2; ++y) {
      for (x = 0; x < 2; ++x) {
        const int ctx = it->top_nz_[4 + ch + x] + it->left_nz_[4 + ch + y];
        VP8SetResidualCoeffs(rd->uv_levels[ch * 2 + x + y * 2], &res);
        it->top_nz_[4 + ch + x] = it->left_nz_[4 + ch + y] =
            VP8RecordCoeffTokens(ctx, &res, tokens);
      }
    }
  }
  VP8IteratorBytesToNz(it);
  return !tokens->error_;
}